

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O1

Orphan<capnp::DynamicValue> * __thiscall
capnp::TextCodec::decode
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,TextCodec *this,StringPtr input,
          Type type,Orphanage orphanage)

{
  uint uVar1;
  uint uVar2;
  ListReader **ppLVar3;
  Builder result;
  Reader src;
  ListReader **ppLVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  Orphanage orphanageParam;
  ArrayPtr<const_char> input_00;
  Fault f;
  ThrowingErrorReporter errorReporter;
  ParserInput parserInput;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> expression;
  Builder lexedTokens;
  ExternalResolver nullResolver;
  ThrowingErrorReporter errorReporter_1;
  Reader tokens;
  ValueTranslator translator;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  undefined1 local_460 [16];
  SegmentBuilder *local_450;
  SegmentBuilder *local_448;
  OrphanBuilder OStack_440;
  ErrorReporter local_420;
  OrphanBuilder *local_418;
  long local_410;
  ListReader *local_408;
  uint local_400;
  ListReader *local_3f8;
  ElementCount local_3f0;
  ListReader *local_3e8;
  uint local_3e0;
  char local_3d8;
  OrphanBuilder local_3d0;
  undefined1 local_3b0 [64];
  StructBuilder local_370;
  Resolver local_348;
  ErrorReporter local_340;
  StructReader local_338;
  ListReader local_308;
  ValueTranslator local_2d8;
  MallocMessageBuilder local_2b8;
  CapnpParser local_1c8;
  
  __return_storage_ptr__->type = UNKNOWN;
  local_418 = &__return_storage_ptr__->builder;
  (__return_storage_ptr__->builder).tag.content = 0;
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
  (__return_storage_ptr__->builder).location = (word *)0x0;
  local_420._vptr_ErrorReporter = (_func_int **)&PTR_addError_0064ada0;
  MallocMessageBuilder::MallocMessageBuilder(&local_2b8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_460,&local_2b8.super_MessageBuilder);
  local_1c8.errorReporter = (ErrorReporter *)local_450;
  local_1c8.orphanage.capTable = (CapTableBuilder *)local_460._8_8_;
  capnp::_::PointerBuilder::initStruct(&local_370,(PointerBuilder *)&local_1c8,(StructSize)0x10000);
  result._builder.capTable = local_370.capTable;
  result._builder.segment = local_370.segment;
  result._builder.data = local_370.data;
  result._builder.pointers = local_370.pointers;
  result._builder.dataSize = local_370.dataSize;
  result._builder.pointerCount = local_370.pointerCount;
  result._builder._38_2_ = local_370._38_2_;
  input_00.size_ = input.content.size_ - 1;
  input_00.ptr = input.content.ptr;
  capnp::compiler::lex(input_00,result,&local_420);
  orphanageParam = MessageBuilder::getOrphanage(&local_2b8.super_MessageBuilder);
  capnp::compiler::CapnpParser::CapnpParser(&local_1c8,orphanageParam,&local_420);
  capnp::_::StructBuilder::asReader(&local_370);
  if (OStack_440.tag.content._4_2_ == 0) {
    local_3b0._24_4_ = 0x7fffffff;
    local_3b0._8_8_ = (CapTableReader *)0x0;
    local_3b0._16_8_ = (SegmentBuilder *)0x0;
    local_3b0._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_3b0._0_8_ = CONCAT71(local_460._1_7_,local_460[0]);
    local_3b0._8_8_ = local_460._8_8_;
    local_3b0._16_8_ = local_448;
    local_3b0._24_4_ = (int)OStack_440.segment;
  }
  capnp::_::PointerReader::getList
            (&local_308,(PointerReader *)local_3b0,INLINE_COMPOSITE,(word *)0x0);
  local_410 = 0;
  local_400 = 0;
  local_3f0 = local_308.elementCount;
  local_3e0 = 0;
  local_408 = &local_308;
  local_3f8 = &local_308;
  local_3e8 = &local_308;
  if (local_308.elementCount == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)local_460,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x57,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal((Fault *)local_460);
  }
  (*(code *)**(undefined8 **)local_1c8.parsers.expression.wrapper)
            (local_460,local_1c8.parsers.expression.wrapper,local_1c8.parsers.expression.parser);
  local_3d8 = local_460[0];
  if (local_460[0] == '\x01') {
    local_3d0.capTable = (CapTableBuilder *)local_448;
    local_3d0.location = (word *)OStack_440.tag.content;
    local_3d0.tag.content = local_460._8_8_;
    local_3d0.segment = local_450;
    local_450 = (SegmentBuilder *)0x0;
    OStack_440.tag.content = 0;
  }
  if ((local_460[0] != '\0') && (local_450 != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_460 + 8));
  }
  if (local_3d8 == '\x01') {
    if (local_400 != local_308.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                ((Fault *)local_460,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x4b,FAILED,"parserInput.getPosition() == tokens.end()",
                 "\"Extra tokens in input.\"",(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal((Fault *)local_460);
    }
    capnp::_::OrphanBuilder::asStructReader(&local_338,&local_3d0,(StructSize)0x20003);
    local_2d8.errorReporter = &local_340;
    local_340._vptr_ErrorReporter = (_func_int **)&PTR_addError_0064ada0;
    local_2d8.resolver = &local_348;
    local_348._vptr_Resolver = (_func_int **)&PTR_resolveConstant_0064add8;
    local_2d8.orphanage.arena = orphanage.arena;
    local_2d8.orphanage.capTable = orphanage.capTable;
    src._reader.capTable = local_338.capTable;
    src._reader.segment = local_338.segment;
    src._reader.data = local_338.data;
    src._reader.pointers = local_338.pointers;
    src._reader.dataSize = local_338.dataSize;
    src._reader.pointerCount = local_338.pointerCount;
    src._reader._38_2_ = local_338._38_2_;
    src._reader.nestingLimit = local_338.nestingLimit;
    src._reader._44_4_ = local_338._44_4_;
    capnp::compiler::ValueTranslator::compileValue
              ((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)local_3b0,&local_2d8,src,type);
    local_460[0] = local_3b0[0];
    if (local_3b0[0] == true) {
      local_448 = (SegmentBuilder *)CONCAT44(local_3b0._28_4_,local_3b0._24_4_);
      OStack_440.tag.content = local_3b0._32_8_;
      local_460._8_8_ = local_3b0._8_8_;
      local_450 = (SegmentBuilder *)local_3b0._16_8_;
      OStack_440.segment = (SegmentBuilder *)local_3b0._40_8_;
      OStack_440.capTable = (CapTableBuilder *)local_3b0._48_8_;
      OStack_440.location = (word *)local_3b0._56_8_;
      local_3b0._40_8_ = (SegmentBuilder *)0x0;
      local_3b0._56_8_ = (word *)0x0;
    }
    if ((local_3b0[0] != false) && ((SegmentBuilder *)local_3b0._40_8_ != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_3b0 + 0x20));
    }
    if (local_460[0] == '\x01') {
      *(SegmentBuilder **)((long)&__return_storage_ptr__->field_1 + 8) = local_448;
      *(undefined8 *)__return_storage_ptr__ = local_460._8_8_;
      (__return_storage_ptr__->field_1).intValue = (int64_t)local_450;
      if ((__return_storage_ptr__->builder).segment != (SegmentBuilder *)0x0) {
        capnp::_::OrphanBuilder::euthanize(local_418);
      }
      (__return_storage_ptr__->builder).segment = OStack_440.segment;
      (__return_storage_ptr__->builder).capTable = OStack_440.capTable;
      (__return_storage_ptr__->builder).location = OStack_440.location;
      (__return_storage_ptr__->builder).tag.content = OStack_440.tag.content;
      OStack_440.segment = (SegmentBuilder *)0x0;
      OStack_440.location = (word *)0x0;
    }
    if ((local_460[0] == '\x01') && (OStack_440.segment != (SegmentBuilder *)0x0)) {
      capnp::_::OrphanBuilder::euthanize(&OStack_440);
    }
  }
  else {
    uVar5 = local_3e0;
    if (local_3e0 < local_400) {
      uVar5 = local_400;
    }
    if (uVar5 == local_308.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)local_460,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x51,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal((Fault *)local_460);
    }
    capnp::_::ListReader::getStructElement
              ((StructReader *)local_460,(&local_408)[(ulong)(local_400 <= local_3e0) * 4],uVar5);
    uVar6 = 0;
    uVar7 = 0;
    if (0x3f < (uint)OStack_440.tag.content) {
      uVar7 = (ulong)*(uint *)((long)&(local_450->super_SegmentReader).arena + 4);
    }
    if (0x9f < (uint)OStack_440.tag.content) {
      uVar6 = (ulong)*(uint *)&(local_450->super_SegmentReader).ptr.ptr;
    }
    (**local_420._vptr_ErrorReporter)(&local_420,uVar7,uVar6,"Parse error",0xc);
  }
  if ((local_3d8 == '\x01') && (local_3d0.segment != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize(&local_3d0);
  }
  if (local_410 != 0) {
    uVar5 = local_3e0;
    ppLVar3 = &local_3e8;
    if (local_3e0 < local_400) {
      uVar5 = local_400;
      ppLVar3 = &local_408;
    }
    uVar1 = *(uint *)(local_410 + 0x30);
    uVar2 = uVar5;
    if (uVar5 <= uVar1) {
      uVar2 = uVar1;
    }
    ppLVar4 = (ListReader **)(local_410 + 0x28);
    if (uVar1 < uVar5) {
      ppLVar4 = ppLVar3;
    }
    *(ListReader **)(local_410 + 0x28) = *ppLVar4;
    *(uint *)(local_410 + 0x30) = uVar2;
  }
  capnp::compiler::CapnpParser::~CapnpParser(&local_1c8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_2b8);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> TextCodec::decode(kj::StringPtr input, Type type, Orphanage orphanage) const {
  Orphan<DynamicValue> output;
  
  lexAndParseExpression(input, [&type, &orphanage, &output](compiler::Expression::Reader expression) {
    ThrowingErrorReporter errorReporter;
    ExternalResolver nullResolver;

    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    KJ_IF_MAYBE(value, translator.compileValue(expression, type)) {
      output = *kj::mv(value);
    } else {
      // An error should have already been given to the errorReporter.
    }
  });
  
  return output;
}